

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O3

S2Point * __thiscall S2PaddedCell::GetCenter(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  S2Point local_28;
  
  iVar3 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  S2::FaceSiTitoXYZ(&local_28,(uint)((this->id_).id_ >> 0x3d),iVar3 + this->ij_lo_[0] * 2,
                    iVar3 + this->ij_lo_[1] * 2);
  dVar2 = SQRT(local_28.c_[1] * local_28.c_[1] + local_28.c_[0] * local_28.c_[0] +
               local_28.c_[2] * local_28.c_[2]);
  dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                  (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  auVar1._8_4_ = SUB84(dVar2 * local_28.c_[1],0);
  auVar1._0_8_ = dVar2 * local_28.c_[0];
  auVar1._12_4_ = (int)((ulong)(dVar2 * local_28.c_[1]) >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->c_ = auVar1;
  __return_storage_ptr__->c_[2] = dVar2 * local_28.c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetCenter() const {
  int ij_size = S2CellId::GetSizeIJ(level_);
  unsigned int si = 2 * ij_lo_[0] + ij_size;
  unsigned int ti = 2 * ij_lo_[1] + ij_size;
  return S2::FaceSiTitoXYZ(id_.face(), si, ti).Normalize();
}